

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_msg.c
# Opt level: O0

void teardown_pipe(void)

{
  if (send_file2 == (FILE *)0x0) {
    if (send_file1 == (FILE *)0x0) {
      eprintf("No messaging setup",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_msg.c"
              ,0x16a);
    }
    fclose((FILE *)send_file1);
    send_file1 = (FILE *)0x0;
    if (send_file1_name != (char *)0x0) {
      unlink(send_file1_name);
      free(send_file1_name);
      send_file1_name = (char *)0x0;
    }
  }
  else {
    fclose((FILE *)send_file2);
    send_file2 = (FILE *)0x0;
    if (send_file2_name != (char *)0x0) {
      unlink(send_file2_name);
      free(send_file2_name);
      send_file2_name = (char *)0x0;
    }
  }
  return;
}

Assistant:

static void teardown_pipe(void)
{
    if(send_file2 != 0)
    {
        fclose(send_file2);
        send_file2 = 0;
        if(send_file2_name != NULL)
        {
            unlink(send_file2_name);
            free(send_file2_name);
            send_file2_name = NULL;
        }
    }
    else if(send_file1 != 0)
    {
        fclose(send_file1);
        send_file1 = 0;
        if(send_file1_name != NULL)
        {
            unlink(send_file1_name);
            free(send_file1_name);
            send_file1_name = NULL;
        }
    }
    else
    {
        eprintf("No messaging setup", __FILE__, __LINE__);
    }
}